

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.c
# Opt level: O3

int VP8PutBitUniform(VP8BitWriter *bw,int bit)

{
  int iVar1;
  
  iVar1 = bw->range_ >> 1;
  if (bit != 0) {
    bw->value_ = bw->value_ + iVar1 + 1;
    iVar1 = bw->range_ - (iVar1 + 1);
  }
  bw->range_ = iVar1;
  if (iVar1 < 0x7f) {
    bw->range_ = (uint)kNewRange[iVar1];
    bw->value_ = bw->value_ << 1;
    iVar1 = bw->nb_bits_;
    bw->nb_bits_ = iVar1 + 1;
    if (-1 < iVar1) {
      Flush(bw);
    }
  }
  return bit;
}

Assistant:

int VP8PutBitUniform(VP8BitWriter* const bw, int bit) {
  const int split = bw->range_ >> 1;
  if (bit) {
    bw->value_ += split + 1;
    bw->range_ -= split + 1;
  } else {
    bw->range_ = split;
  }
  if (bw->range_ < 127) {
    bw->range_ = kNewRange[bw->range_];
    bw->value_ <<= 1;
    bw->nb_bits_ += 1;
    if (bw->nb_bits_ > 0) Flush(bw);
  }
  return bit;
}